

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

int32_t icu_63::number::impl::CurrencySpacingEnabledModifier::applyCurrencySpacingAffix
                  (NumberStringBuilder *output,int32_t index,EAffix affix,
                  DecimalFormatSymbols *symbols,UErrorCode *status)

{
  UBool UVar1;
  UChar32 UVar2;
  int32_t iVar3;
  ValueOrHeapArray<UNumberFormatFields> *pVVar4;
  UnicodeString spacingString;
  UnicodeSet numberUniset;
  UnicodeSet affixUniset;
  
  if (affix == PREFIX) {
    if (output->fUsingHeap == false) {
      pVVar4 = &output->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(output->fFields).heap.ptr;
    }
    if (*(int *)((long)pVVar4 + ((long)output->fZero + (long)index) * 4 + -4) != 7) {
      return 0;
    }
    UVar2 = NumberStringBuilder::codePointBefore(output,index);
  }
  else {
    if (output->fUsingHeap == false) {
      pVVar4 = &output->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(output->fFields).heap.ptr;
    }
    if (pVVar4->value[(long)index + (long)output->fZero] != UNUM_CURRENCY_FIELD) {
      return 0;
    }
    UVar2 = NumberStringBuilder::codePointAt(output,index);
  }
  iVar3 = 0;
  getUnicodeSet(&affixUniset,symbols,IN_CURRENCY,affix,status);
  UVar1 = UnicodeSet::contains(&affixUniset,UVar2);
  if (UVar1 != '\0') {
    if (affix == PREFIX) {
      UVar2 = NumberStringBuilder::codePointAt(output,index);
    }
    else {
      UVar2 = NumberStringBuilder::codePointBefore(output,index);
    }
    getUnicodeSet(&numberUniset,symbols,IN_NUMBER,affix,status);
    UVar1 = UnicodeSet::contains(&numberUniset,UVar2);
    if (UVar1 == '\0') {
      iVar3 = 0;
    }
    else {
      getInsertString(&spacingString,symbols,affix,status);
      iVar3 = NumberStringBuilder::insert(output,index,&spacingString,UNUM_FIELD_COUNT,status);
      UnicodeString::~UnicodeString(&spacingString);
    }
    UnicodeSet::~UnicodeSet(&numberUniset);
  }
  UnicodeSet::~UnicodeSet(&affixUniset);
  return iVar3;
}

Assistant:

int32_t
CurrencySpacingEnabledModifier::applyCurrencySpacingAffix(NumberStringBuilder &output, int32_t index,
                                                          EAffix affix,
                                                          const DecimalFormatSymbols &symbols,
                                                          UErrorCode &status) {
    // NOTE: For prefix, output.fieldAt(index-1) gets the last field type in the prefix.
    // This works even if the last code point in the prefix is 2 code units because the
    // field value gets populated to both indices in the field array.
    Field affixField = (affix == PREFIX) ? output.fieldAt(index - 1) : output.fieldAt(index);
    if (affixField != UNUM_CURRENCY_FIELD) {
        return 0;
    }
    int affixCp = (affix == PREFIX) ? output.codePointBefore(index) : output.codePointAt(index);
    UnicodeSet affixUniset = getUnicodeSet(symbols, IN_CURRENCY, affix, status);
    if (!affixUniset.contains(affixCp)) {
        return 0;
    }
    int numberCp = (affix == PREFIX) ? output.codePointAt(index) : output.codePointBefore(index);
    UnicodeSet numberUniset = getUnicodeSet(symbols, IN_NUMBER, affix, status);
    if (!numberUniset.contains(numberCp)) {
        return 0;
    }
    UnicodeString spacingString = getInsertString(symbols, affix, status);

    // NOTE: This next line *inserts* the spacing string, triggering an arraycopy.
    // It would be more efficient if this could be done before affixes were attached,
    // so that it could be prepended/appended instead of inserted.
    // However, the build code path is more efficient, and this is the most natural
    // place to put currency spacing in the non-build code path.
    // TODO: Should we use the CURRENCY field here?
    return output.insert(index, spacingString, UNUM_FIELD_COUNT, status);
}